

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

int Lf_ManFindCofVar(word *pTruth,int nWords,int nVars)

{
  int iVar1;
  int local_42c;
  int iVar;
  word uTruthCof [128];
  int nVars_local;
  int nWords_local;
  word *pTruth_local;
  
  local_42c = 0;
  do {
    if (nVars <= local_42c) {
      return -1;
    }
    Abc_TtCofactor0p((word *)&stack0xfffffffffffffbd8,pTruth,nWords,local_42c);
    iVar1 = Abc_TtSupportSize((word *)&stack0xfffffffffffffbd8,nVars);
    if (1 < iVar1) {
      Abc_TtCofactor1p((word *)&stack0xfffffffffffffbd8,pTruth,nWords,local_42c);
      iVar1 = Abc_TtSupportSize((word *)&stack0xfffffffffffffbd8,nVars);
      if (1 < iVar1) {
        return local_42c;
      }
    }
    local_42c = local_42c + 1;
  } while( true );
}

Assistant:

static inline int Lf_ManFindCofVar( word * pTruth, int nWords, int nVars )
{
    word uTruthCof[LF_TT_WORDS]; int iVar;
    for ( iVar = 0; iVar < nVars; iVar++ )
    {
        Abc_TtCofactor0p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        Abc_TtCofactor1p( uTruthCof, pTruth, nWords, iVar );
        if ( Abc_TtSupportSize(uTruthCof, nVars) < 2 )
            continue;
        return iVar;
    }
    return -1;
}